

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O3

bool __thiscall QAbstractSocket::waitForConnected(QAbstractSocket *this,int msecs)

{
  bool bVar1;
  QAbstractSocketPrivate *this_00;
  QAbstractSocketEngine *pQVar2;
  bool bVar3;
  char cVar4;
  long lVar5;
  int iVar6;
  QHostAddress *pQVar7;
  QArrayDataPointer<QHostAddress> *this_01;
  QArrayData *pQVar8;
  long in_FS_OFFSET;
  bool timedOut;
  QHostAddress temp;
  undefined1 local_78 [24];
  QHostAddress *pQStack_60;
  QArrayDataPointer<QHostAddress> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketPrivate **)&this->field_0x8;
  bVar3 = true;
  if (this_00->state == ConnectedState) goto LAB_001c137f;
  bVar1 = this_00->pendingClose;
  this_00->pendingClose = false;
  local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QHostAddress *)&DAT_aaaaaaaaaaaaaaaa;
  QDeadlineTimer::QDeadlineTimer((QDeadlineTimer *)(local_78 + 0x10),(long)msecs,CoarseTimer);
  if (this_00->state == HostLookupState) {
    QHostInfo::abortHostLookup(this_00->hostLookupId);
    this_00->hostLookupId = -1;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QHostAddress::QHostAddress((QHostAddress *)(local_78 + 8));
    bVar3 = QHostAddress::setAddress((QHostAddress *)(local_78 + 8),&this_00->hostName);
    if (bVar3) {
      this_01 = (QArrayDataPointer<QHostAddress> *)local_78;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QHostInfo::QHostInfo((QHostInfo *)this_01,-1);
      local_58.d = (Data *)0x0;
      local_58.ptr = (QHostAddress *)0x0;
      local_58.size = 0;
      QtPrivate::QMovableArrayOps<QHostAddress>::emplace<QHostAddress_const&>
                ((QMovableArrayOps<QHostAddress> *)&local_58,0,(QHostAddress *)(local_78 + 8));
      QList<QHostAddress>::end((QList<QHostAddress> *)&local_58);
      QHostInfo::setAddresses((QHostInfo *)this_01,(QList<QHostAddress> *)&local_58);
      QArrayDataPointer<QHostAddress>::~QArrayDataPointer(&local_58);
      QAbstractSocketPrivate::_q_startConnecting(this_00,(QHostInfo *)this_01);
    }
    else {
      this_01 = &local_58;
      QHostInfo::fromName((QHostInfo *)this_01,&this_00->hostName);
      QAbstractSocketPrivate::_q_startConnecting(this_00,(QHostInfo *)this_01);
    }
    QHostInfo::~QHostInfo((QHostInfo *)this_01);
    QHostAddress::~QHostAddress((QHostAddress *)(local_78 + 8));
  }
  lVar5 = *(long *)&this->field_0x8;
  if (*(int *)(lVar5 + 0x260) == 0) {
    bVar3 = false;
    goto LAB_001c137f;
  }
  local_78[0] = 1;
  if (*(int *)(lVar5 + 0x260) == 2) {
    do {
      cVar4 = QDeadlineTimer::hasExpired();
      pQVar7 = pQStack_60;
      pQVar8 = (QArrayData *)local_78._16_8_;
      if (cVar4 != '\0') {
        lVar5 = *(long *)&this->field_0x8;
        break;
      }
      if ((QArrayData *)local_78._16_8_ == (QArrayData *)0x7fffffffffffffff) {
        pQVar8 = (QArrayData *)0x7fffffffffffffff;
      }
      else {
        lVar5 = QDeadlineTimer::rawRemainingTimeNSecs();
        if (30000000000 < lVar5) {
          local_58.d = (Data *)0x0;
          local_58.ptr = (QHostAddress *)&DAT_100000000;
          QDeadlineTimer::setPreciseRemainingTime((longlong)&local_58,0,0xfc23ac00);
          pQVar7 = local_58.ptr;
          pQVar8 = &(local_58.d)->super_QArrayData;
        }
      }
      local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00;
      pQVar2 = this_00->socketEngine;
      if (((pQVar2 == (QAbstractSocketEngine *)0x0) ||
          (cVar4 = (**(code **)(*(long *)pQVar2 + 0x128))(pQVar2,pQVar8,pQVar7,local_78),
          cVar4 == '\0')) || (local_78[0] != '\0')) {
        QAbstractSocketPrivate::_q_connectToNextAddress(this_00);
      }
      else {
        QAbstractSocketPrivate::_q_testConnection(this_00);
      }
      lVar5 = *(long *)&this->field_0x8;
    } while (*(int *)(lVar5 + 0x260) == 2);
    if ((local_78._0_8_ & 1) != 0) goto LAB_001c129b;
    iVar6 = *(int *)(lVar5 + 0x260);
    if (iVar6 == 2) goto LAB_001c12bd;
  }
  else {
LAB_001c129b:
    iVar6 = 3;
    if (*(int *)(lVar5 + 0x260) != 3) {
LAB_001c12bd:
      QMetaObject::tr((char *)&local_58,(char *)&staticMetaObject,0x27d578);
      this_00->socketError = SocketTimeoutError;
      QString::operator=((QString *)&this_00->field_0x168,(QString *)&local_58);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
        }
      }
      this_00->state = UnconnectedState;
      local_58.ptr = (QHostAddress *)(local_78 + 8);
      local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
      local_58.d = (Data *)0x0;
      QMetaObject::activate((QObject *)this,&staticMetaObject,3,&local_58.d);
      QAbstractSocketPrivate::resetSocketLayer(this_00);
      iVar6 = *(int *)(*(long *)&this->field_0x8 + 0x260);
    }
  }
  bVar3 = iVar6 == 3;
  if ((bVar3) && (bVar1 != false)) {
    (**(code **)(*(long *)this + 0x100))(this);
  }
LAB_001c137f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QAbstractSocket::waitForConnected(int msecs)
{
    Q_D(QAbstractSocket);
#if defined (QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocket::waitForConnected(%i)", msecs);
#endif

    if (state() == ConnectedState) {
#if defined (QABSTRACTSOCKET_DEBUG)
        qDebug("QAbstractSocket::waitForConnected(%i) already connected", msecs);
#endif
        return true;
    }

    bool wasPendingClose = d->pendingClose;
    d->pendingClose = false;
    QDeadlineTimer deadline{msecs};

    if (d->state == HostLookupState) {
#if defined (QABSTRACTSOCKET_DEBUG)
        qDebug("QAbstractSocket::waitForConnected(%i) doing host name lookup", msecs);
#endif
        QHostInfo::abortHostLookup(d->hostLookupId);
        d->hostLookupId = -1;
        QHostAddress temp;
        if (temp.setAddress(d->hostName)) {
            QHostInfo info;
            info.setAddresses(QList<QHostAddress>() << temp);
            d->_q_startConnecting(info);
        } else {
            d->_q_startConnecting(QHostInfo::fromName(d->hostName));
        }
    }
    if (state() == UnconnectedState)
        return false; // connect not im progress anymore!

    bool timedOut = true;
#if defined (QABSTRACTSOCKET_DEBUG)
    int attempt = 1;
#endif
    while (state() == ConnectingState && !deadline.hasExpired()) {
        QDeadlineTimer timer = deadline;
        if (!deadline.isForever() && deadline.remainingTimeAsDuration() > DefaultConnectTimeout)
            timer = QDeadlineTimer(DefaultConnectTimeout);
#if defined (QABSTRACTSOCKET_DEBUG)
        qDebug("QAbstractSocket::waitForConnected(%i) waiting %.2f secs for connection attempt #%i",
               msecs, timer.remainingTime() / 1000.0, attempt++);
#endif
        timedOut = false;

        if (d->socketEngine && d->socketEngine->waitForWrite(timer, &timedOut) && !timedOut) {
            d->_q_testConnection();
        } else {
            d->_q_connectToNextAddress();
        }
    }

    if ((timedOut && state() != ConnectedState) || state() == ConnectingState) {
        d->setError(SocketTimeoutError, tr("Socket operation timed out"));
        d->state = UnconnectedState;
        emit stateChanged(d->state);
        d->resetSocketLayer();
    }

#if defined (QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocket::waitForConnected(%i) == %s", msecs,
           state() == ConnectedState ? "true" : "false");
#endif
    if (state() != ConnectedState)
        return false;
    if (wasPendingClose)
        disconnectFromHost();
    return true;
}